

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Element.cpp
# Opt level: O3

Element * __thiscall Rml::Element::QuerySelector(Element *this,String *selectors)

{
  pointer pcVar1;
  Element *pEVar2;
  StyleSheetNodeListRaw leaf_nodes;
  StyleSheetNode root_node;
  StyleSheetNodeListRaw local_150;
  String local_138;
  undefined1 local_118 [96];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8 [24];
  vector<Rml::AttributeSelector,_std::allocator<Rml::AttributeSelector>_> local_a0;
  vector<Rml::StructuralSelector,_std::allocator<Rml::StructuralSelector>_> local_88;
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  local_60;
  vector<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>,_std::allocator<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>_>_>
  local_30;
  
  StyleSheetNode::StyleSheetNode((StyleSheetNode *)local_118);
  StyleSheetParser::ConstructNodes(&local_150,(StyleSheetNode *)local_118,selectors);
  if (local_150.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      local_150.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    pcVar1 = (selectors->_M_dataplus)._M_p;
    GetAddress_abi_cxx11_(&local_138,this,false,true);
    Log::Message(LT_WARNING,"Query selector \'%s\' is empty. In element %s",pcVar1,
                 local_138._M_dataplus._M_p);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
    }
    pEVar2 = (Element *)0x0;
  }
  else {
    pEVar2 = QuerySelectorMatchRecursive(&local_150,this,this);
  }
  if (local_150.super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_150.
                    super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_150.
                          super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_150.
                          super__Vector_base<Rml::StyleSheetNode_*,_std::allocator<Rml::StyleSheetNode_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  ::std::
  vector<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>,_std::allocator<std::unique_ptr<Rml::StyleSheetNode,_std::default_delete<Rml::StyleSheetNode>_>_>_>
  ::~vector(&local_30);
  robin_hood::detail::
  Table<true,_80UL,_Rml::PropertyId,_Rml::Property,_robin_hood::hash<Rml::PropertyId,_void>,_std::equal_to<Rml::PropertyId>_>
  ::destroy(&local_60);
  ::std::vector<Rml::StructuralSelector,_std::allocator<Rml::StructuralSelector>_>::~vector
            (&local_88);
  ::std::vector<Rml::AttributeSelector,_std::allocator<Rml::AttributeSelector>_>::~vector(&local_a0)
  ;
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_b8);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_118 + 0x48));
  if ((undefined1 *)local_118._40_8_ != local_118 + 0x38) {
    operator_delete((void *)local_118._40_8_,local_118._56_8_ + 1);
  }
  if ((undefined1 *)local_118._8_8_ != local_118 + 0x18) {
    operator_delete((void *)local_118._8_8_,local_118._24_8_ + 1);
  }
  return pEVar2;
}

Assistant:

Element* Element::QuerySelector(const String& selectors)
{
	StyleSheetNode root_node;
	StyleSheetNodeListRaw leaf_nodes = StyleSheetParser::ConstructNodes(root_node, selectors);

	if (leaf_nodes.empty())
	{
		Log::Message(Log::LT_WARNING, "Query selector '%s' is empty. In element %s", selectors.c_str(), GetAddress().c_str());
		return nullptr;
	}

	return QuerySelectorMatchRecursive(leaf_nodes, this, this);
}